

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalForcesContIntDamping
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_1,__1,__1> *a_lhs;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 (*pauVar5) [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  void *pvVar60;
  ulong uVar61;
  undefined8 *puVar62;
  double *pdVar63;
  char *pcVar64;
  double *pdVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  double dVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  double dVar106;
  double dVar107;
  double dVar108;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  double dVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  double dVar124;
  undefined1 auVar127 [32];
  double dVar128;
  double dVar131;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  double dVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  VectorNIP_D0 E_BlockDamping_D0;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  undefined1 local_1780 [40];
  double dStack_1758;
  double dStack_1750;
  double dStack_1748;
  double local_1740;
  double dStack_1738;
  double dStack_1730;
  double dStack_1728;
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  double local_16e0;
  double dStack_16d8;
  double dStack_16d0;
  double dStack_16c8;
  double local_16c0;
  double dStack_16b8;
  double dStack_16b0;
  double dStack_16a8;
  undefined1 local_16a0 [16];
  undefined1 auStack_1690 [16];
  double local_1680;
  double dStack_1678;
  double dStack_1670;
  double dStack_1668;
  double local_1660;
  double dStack_1658;
  double dStack_1650;
  double dStack_1648;
  undefined1 local_1640 [16];
  double dStack_1630;
  double dStack_1628;
  double local_1620;
  double dStack_1618;
  double dStack_1610;
  double dStack_1608;
  double local_1600;
  double dStack_15f8;
  double dStack_15f0;
  double dStack_15e8;
  double local_15e0;
  double dStack_15d8;
  double dStack_15d0;
  double dStack_15c8;
  undefined1 local_15c0 [32];
  Scalar local_1588;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  double local_14e0;
  double dStack_14d8;
  double dStack_14d0;
  double dStack_14c8;
  double local_14c0;
  double dStack_14b8;
  double dStack_14b0;
  double dStack_14a8;
  undefined1 local_14a0 [32];
  double local_1480;
  double dStack_1478;
  double dStack_1470;
  double dStack_1468;
  double local_1460;
  double dStack_1458;
  double dStack_1450;
  double dStack_1448;
  double local_1440;
  double dStack_1438;
  double dStack_1430;
  double dStack_1428;
  double local_1420;
  double dStack_1418;
  double dStack_1410;
  double dStack_1408;
  double local_1400;
  double dStack_13f8;
  double dStack_13f0;
  double dStack_13e8;
  double local_13e0;
  double dStack_13d8;
  double dStack_13d0;
  double dStack_13c8;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [16];
  double dStack_1310;
  double dStack_1308;
  double local_1300;
  double dStack_12f8;
  double dStack_12f0;
  double dStack_12e8;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [16];
  double dStack_12b0;
  double dStack_12a8;
  undefined1 local_12a0 [16];
  double dStack_1290;
  double dStack_1288;
  double local_1280;
  double dStack_1278;
  double dStack_1270;
  double dStack_1268;
  double local_1260;
  double dStack_1258;
  double dStack_1250;
  double dStack_1248;
  double local_1240;
  double dStack_1238;
  double dStack_1230;
  double dStack_1228;
  double local_1220;
  double dStack_1218;
  double dStack_1210;
  double dStack_1208;
  double local_1200;
  double dStack_11f8;
  double dStack_11f0;
  double dStack_11e8;
  double local_11e0;
  double dStack_11d8;
  double dStack_11d0;
  double dStack_11c8;
  double local_11c0;
  double dStack_11b8;
  double dStack_11b0;
  double dStack_11a8;
  double local_11a0;
  double dStack_1198;
  double dStack_1190;
  double dStack_1188;
  double local_1180;
  double dStack_1178;
  double dStack_1170;
  double dStack_1168;
  double local_1160;
  double dStack_1158;
  double dStack_1150;
  double dStack_1148;
  double local_1140;
  double dStack_1138;
  double dStack_1130;
  double dStack_1128;
  double local_1120;
  double dStack_1118;
  double dStack_1110;
  double dStack_1108;
  double local_1100;
  double dStack_10f8;
  double dStack_10f0;
  double dStack_10e8;
  double local_10e0;
  double dStack_10d8;
  double dStack_10d0;
  double dStack_10c8;
  double local_10c0;
  double dStack_10b8;
  double dStack_10b0;
  double dStack_10a8;
  double local_10a0;
  double dStack_1098;
  double dStack_1090;
  double dStack_1088;
  double local_1080;
  double dStack_1078;
  double dStack_1070;
  double dStack_1068;
  double local_1060;
  double dStack_1058;
  double dStack_1050;
  double dStack_1048;
  double local_1040;
  double dStack_1038;
  double dStack_1030;
  double dStack_1028;
  double local_1020;
  double dStack_1018;
  double dStack_1010;
  double dStack_1008;
  double local_1000;
  double dStack_ff8;
  double dStack_ff0;
  double dStack_fe8;
  double local_fe0;
  double dStack_fd8;
  double dStack_fd0;
  double dStack_fc8;
  double local_fc0;
  double dStack_fb8;
  double dStack_fb0;
  double dStack_fa8;
  double local_fa0;
  double dStack_f98;
  double dStack_f90;
  double dStack_f88;
  Matrix<double,_45,_3,_0,_45,_3> local_f70;
  undefined1 local_b30 [128];
  double local_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double dStack_a98;
  undefined1 local_a90 [32];
  undefined1 local_a70 [32];
  undefined1 local_a50 [32];
  undefined1 local_a30 [32];
  double local_a10;
  double dStack_a08;
  double local_a00;
  double local_9f8;
  double dStack_9f0;
  double local_9e8;
  double local_9e0;
  double dStack_9d8;
  double local_9d0;
  double local_9c8;
  double dStack_9c0;
  double dStack_9b8;
  double dStack_9b0;
  double local_9a8;
  double dStack_9a0;
  double dStack_998;
  double dStack_990;
  double local_988;
  double dStack_980;
  double dStack_978;
  double dStack_970;
  double local_968;
  double dStack_960;
  double dStack_958;
  double dStack_950;
  double local_948;
  double dStack_940;
  double dStack_938;
  double dStack_930;
  double local_928;
  double dStack_920;
  double dStack_918;
  double dStack_910;
  undefined1 local_908 [32];
  undefined1 local_8e8 [32];
  undefined1 local_8c8 [32];
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double local_890;
  double dStack_888;
  double local_880;
  double local_878;
  double dStack_870;
  double local_868;
  double local_860;
  double dStack_858;
  double dStack_850;
  double dStack_848;
  double local_840;
  double dStack_838;
  double dStack_830;
  double dStack_828;
  double local_820;
  double dStack_818;
  double dStack_810;
  double dStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  double local_740;
  double dStack_738;
  double local_730;
  double local_728;
  double dStack_720;
  double local_718;
  double local_710;
  double dStack_708;
  double local_700;
  double local_6f8;
  double dStack_6f0;
  double dStack_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double dStack_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double dStack_6a8;
  double dStack_6a0;
  undefined1 local_698 [32];
  double local_678;
  double dStack_670;
  double dStack_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double dStack_648;
  double dStack_640;
  undefined1 local_638 [32];
  undefined1 local_618 [32];
  double local_5f8;
  double dStack_5f0;
  double dStack_5e8;
  double dStack_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8;
  double local_5c0;
  double dStack_5b8;
  double local_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double local_590;
  double dStack_588;
  double dStack_580;
  double dStack_578;
  double local_570;
  double dStack_568;
  double dStack_560;
  double dStack_558;
  double local_550;
  double dStack_548;
  double dStack_540;
  double dStack_538;
  double local_530;
  double dStack_528;
  double dStack_520;
  double dStack_518;
  double local_510;
  double dStack_508;
  double dStack_500;
  double dStack_4f8;
  double local_4f0;
  double dStack_4e8;
  double dStack_4e0;
  double dStack_4d8;
  undefined1 local_4d0 [32];
  undefined1 local_4b0 [32];
  undefined1 local_490 [32];
  double local_470;
  double dStack_468;
  double local_460;
  double local_458;
  double dStack_450;
  double local_448;
  double local_440;
  double dStack_438;
  double local_430;
  double local_428;
  double dStack_420;
  double dStack_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double dStack_3f8;
  double dStack_3f0;
  double local_3e8;
  double dStack_3e0;
  double dStack_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double dStack_3b8;
  double dStack_3b0;
  undefined1 local_3a8 [32];
  undefined1 local_388 [32];
  double local_368;
  double dStack_360;
  double dStack_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double dStack_338;
  double dStack_330;
  undefined1 local_328 [32];
  double local_308;
  double dStack_300;
  double local_2f8;
  double local_2f0;
  double dStack_2e8;
  double local_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  Matrix<double,_8,_3,_1,_8,_3> local_2c0;
  MatrixNx6 local_200;
  
  CalcCombinedCoordMatrix(this,&local_200);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 8) {
    pcVar64 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, 8, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, 8, 6, 1>, Option = 0]"
    ;
LAB_007099a8:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar64);
  }
  a_lhs = &this->m_SD;
  local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[0]
       = (double)a_lhs;
  local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[1]
       = (double)&local_200;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      == 0x2d) {
    memset((Matrix<double,_45,_6,_0,_45,_6> *)local_b30,0,0x870);
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[0]
         = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,8,6,1,8,6>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,45,6,0,45,6>>
              ((Matrix<double,_45,_6,_0,_45,_6> *)local_b30,
               (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_f70,&local_200,
               (Scalar *)&local_2c0);
    peVar3 = (this->m_material).
             super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (this->m_material).
             super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
    [1] = (double)local_1780;
    local_fe0 = local_6f8;
    dStack_fd8 = dStack_6f0;
    dStack_fd0 = dStack_6e8;
    dStack_fc8 = dStack_6e0;
    local_1020 = local_590;
    dStack_1018 = dStack_588;
    dStack_1010 = dStack_580;
    dStack_1008 = dStack_578;
    local_1080 = local_428;
    dStack_1078 = dStack_420;
    dStack_1070 = dStack_418;
    dStack_1068 = dStack_410;
    local_1780._0_8_ =
         (double)local_b30._0_8_ * local_6f8 + local_9c8 * local_590 + local_860 * local_428;
    local_1780._8_8_ =
         (double)local_b30._8_8_ * dStack_6f0 + dStack_9c0 * dStack_588 + dStack_858 * dStack_420;
    local_1780._16_8_ =
         (double)local_b30._16_8_ * dStack_6e8 + dStack_9b8 * dStack_580 + dStack_850 * dStack_418;
    local_1780._24_8_ =
         (double)local_b30._24_8_ * dStack_6e0 + dStack_9b0 * dStack_578 + dStack_848 * dStack_410;
    local_1040 = local_570;
    dStack_1038 = dStack_568;
    dStack_1030 = dStack_560;
    dStack_1028 = dStack_558;
    local_fc0 = local_6d8;
    dStack_fb8 = dStack_6d0;
    dStack_fb0 = dStack_6c8;
    dStack_fa8 = dStack_6c0;
    local_10a0 = local_408;
    dStack_1098 = dStack_400;
    dStack_1090 = dStack_3f8;
    dStack_1088 = dStack_3f0;
    dStack_1758 = (double)local_b30._40_8_ * dStack_6d0 + dStack_9a0 * dStack_568 +
                  dStack_838 * dStack_400;
    local_1780._32_8_ =
         (double)local_b30._32_8_ * local_6d8 + local_9a8 * local_570 + local_840 * local_408;
    dStack_1750 = (double)local_b30._48_8_ * dStack_6c8 + dStack_998 * dStack_560 +
                  dStack_830 * dStack_3f8;
    dStack_1748 = (double)local_b30._56_8_ * dStack_6c0 + dStack_990 * dStack_558 +
                  dStack_828 * dStack_3f0;
    local_1000 = local_550;
    dStack_ff8 = dStack_548;
    dStack_ff0 = dStack_540;
    dStack_fe8 = dStack_538;
    local_fa0 = local_6b8;
    dStack_f98 = dStack_6b0;
    dStack_f90 = dStack_6a8;
    dStack_f88 = dStack_6a0;
    local_1060 = local_3e8;
    dStack_1058 = dStack_3e0;
    dStack_1050 = dStack_3d8;
    dStack_1048 = dStack_3d0;
    dStack_1738 = (double)local_b30._72_8_ * dStack_6b0 + dStack_980 * dStack_548 +
                  dStack_818 * dStack_3e0;
    local_1740 = (double)local_b30._64_8_ * local_6b8 + local_988 * local_550 +
                 local_820 * local_3e8;
    dStack_1730 = (double)local_b30._80_8_ * dStack_6a8 + dStack_978 * dStack_540 +
                  dStack_810 * dStack_3d8;
    dStack_1728 = (double)local_b30._88_8_ * dStack_6a0 + dStack_970 * dStack_538 +
                  dStack_808 * dStack_3d0;
    dVar124 = this->m_Alpha;
    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
    [0] = dVar124 + dVar124;
    if (((this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_rows == 0xc) &&
       ((this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols == 1)) {
      auVar67._8_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[1];
      auVar67._0_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      local_11e0 = (double)local_b30._64_8_;
      dStack_11d8 = (double)local_b30._72_8_;
      dStack_11d0 = (double)local_b30._80_8_;
      dStack_11c8 = (double)local_b30._88_8_;
      local_1420 = local_988;
      dStack_1418 = dStack_980;
      dStack_1410 = dStack_978;
      dStack_1408 = dStack_970;
      local_1660 = local_820;
      dStack_1658 = dStack_818;
      dStack_1650 = dStack_810;
      dStack_1648 = dStack_808;
      local_1440 = local_9a8;
      dStack_1438 = dStack_9a0;
      dStack_1430 = dStack_998;
      dStack_1428 = dStack_990;
      local_1460 = local_840;
      dStack_1458 = dStack_838;
      dStack_1450 = dStack_830;
      dStack_1448 = dStack_828;
      pdVar63 = (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_1260 = local_860;
      dStack_1258 = dStack_858;
      dStack_1250 = dStack_850;
      dStack_1248 = dStack_848;
      local_1300 = local_9c8;
      dStack_12f8 = dStack_9c0;
      dStack_12f0 = dStack_9b8;
      dStack_12e8 = dStack_9b0;
      local_14c0 = (double)local_b30._0_8_;
      dStack_14b8 = (double)local_b30._8_8_;
      dStack_14b0 = (double)local_b30._16_8_;
      dStack_14a8 = (double)local_b30._24_8_;
      local_1680 = (double)local_b30._32_8_;
      dStack_1678 = (double)local_b30._40_8_;
      dStack_1670 = (double)local_b30._48_8_;
      dStack_1668 = (double)local_b30._56_8_;
      pdVar65 = (double *)vpextrq_avx(auVar67,1);
      _local_1320 = local_698;
      auVar57 = _local_1320;
      _local_12a0 = local_3a8;
      auVar59 = _local_12a0;
      local_1280 = local_3c8;
      dStack_1278 = dStack_3c0;
      dStack_1270 = dStack_3b8;
      dStack_1268 = dStack_3b0;
      _local_12c0 = local_388;
      auVar58 = _local_12c0;
      dStack_10a8 = (peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array[0] * 0.5;
      local_16e0 = local_968;
      dStack_16d8 = dStack_960;
      dStack_16d0 = dStack_958;
      dStack_16c8 = dStack_950;
      local_1100 = ((double)local_b30._0_8_ * (double)local_b30._0_8_ + local_9c8 * local_9c8 +
                    local_860 * local_860 + -1.0 +
                   local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] * *pdVar65) * *pdVar63 * dStack_10a8;
      dStack_10f8 = ((double)local_b30._8_8_ * (double)local_b30._8_8_ + dStack_9c0 * dStack_9c0 +
                     dStack_858 * dStack_858 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[1]) * pdVar63[1] * dStack_10a8;
      dStack_10f0 = ((double)local_b30._16_8_ * (double)local_b30._16_8_ + dStack_9b8 * dStack_9b8 +
                     dStack_850 * dStack_850 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[2]) * pdVar63[2] * dStack_10a8;
      dStack_10e8 = ((double)local_b30._24_8_ * (double)local_b30._24_8_ + dStack_9b0 * dStack_9b0 +
                     dStack_848 * dStack_848 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[3]) * pdVar63[3] * dStack_10a8;
      local_10e0 = ((double)local_b30._32_8_ * (double)local_b30._32_8_ + local_9a8 * local_9a8 +
                    local_840 * local_840 + -1.0 +
                   local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] * pdVar65[4]) * pdVar63[4] * dStack_10a8;
      dStack_10d8 = ((double)local_b30._40_8_ * (double)local_b30._40_8_ + dStack_9a0 * dStack_9a0 +
                     dStack_838 * dStack_838 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[5]) * pdVar63[5] * dStack_10a8;
      dStack_10d0 = ((double)local_b30._48_8_ * (double)local_b30._48_8_ + dStack_998 * dStack_998 +
                     dStack_830 * dStack_830 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[6]) * pdVar63[6] * dStack_10a8;
      dStack_10c8 = ((double)local_b30._56_8_ * (double)local_b30._56_8_ + dStack_990 * dStack_990 +
                     dStack_828 * dStack_828 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[7]) * pdVar63[7] * dStack_10a8;
      local_10c0 = ((double)local_b30._64_8_ * (double)local_b30._64_8_ + local_988 * local_988 +
                    local_820 * local_820 + -1.0 +
                   local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] * pdVar65[8]) * pdVar63[8] * dStack_10a8;
      dStack_10b8 = ((double)local_b30._72_8_ * (double)local_b30._72_8_ + dStack_980 * dStack_980 +
                     dStack_818 * dStack_818 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[9]) * pdVar63[9] * dStack_10a8;
      dStack_10b0 = ((double)local_b30._80_8_ * (double)local_b30._80_8_ + dStack_978 * dStack_978 +
                     dStack_810 * dStack_810 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[10]) * pdVar63[10] * dStack_10a8;
      dStack_10a8 = ((double)local_b30._88_8_ * (double)local_b30._88_8_ + dStack_970 * dStack_970 +
                     dStack_808 * dStack_808 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] * pdVar65[0xb]) * pdVar63[0xb] * dStack_10a8;
      auVar76 = vmulpd_avx512vl(local_b30._96_32_,local_698);
      local_1700 = local_b30._96_32_;
      local_1600 = local_530;
      dStack_15f8 = dStack_528;
      dStack_15f0 = dStack_520;
      dStack_15e8 = dStack_518;
      dVar128 = local_800._0_8_;
      dVar7 = local_800._8_8_;
      dVar12 = local_800._16_8_;
      dVar19 = local_800._24_8_;
      local_1540 = local_800;
      local_14e0 = local_948;
      dStack_14d8 = dStack_940;
      dStack_14d0 = dStack_938;
      dStack_14c8 = dStack_930;
      local_16c0 = local_ab0;
      dStack_16b8 = dStack_aa8;
      dStack_16b0 = dStack_aa0;
      dStack_16a8 = dStack_a98;
      local_1620 = local_678;
      dStack_1618 = dStack_670;
      dStack_1610 = dStack_668;
      dStack_1608 = dStack_660;
      local_13e0 = local_510;
      dStack_13d8 = dStack_508;
      dStack_13d0 = dStack_500;
      dStack_13c8 = dStack_4f8;
      auVar77 = vmulpd_avx512vl(local_7e0,local_3a8);
      _local_16a0 = local_7e0;
      auVar56 = _local_16a0;
      local_1480 = local_928;
      dStack_1478 = dStack_920;
      dStack_1470 = dStack_918;
      dStack_1468 = dStack_910;
      local_14a0 = local_a90;
      local_15e0 = local_658;
      dStack_15d8 = dStack_650;
      dStack_15d0 = dStack_648;
      dStack_15c8 = dStack_640;
      local_1400 = local_4f0;
      dStack_13f8 = dStack_4e8;
      dStack_13f0 = dStack_4e0;
      dStack_13e8 = dStack_4d8;
      auVar78 = vmulpd_avx512vl(local_7c0,local_388);
      local_1720 = local_7c0;
      dVar131 = local_b30._96_8_;
      dVar8 = local_b30._104_8_;
      dVar13 = local_b30._112_8_;
      dVar20 = local_b30._120_8_;
      auVar79 = vmulpd_avx512vl(local_800,local_800);
      auVar80 = vmulpd_avx512vl(local_7e0,local_7e0);
      auVar81 = vmulpd_avx512vl(local_8c8,local_8c8);
      local_1380 = local_8c8;
      auVar82 = vmulpd_avx512vl(local_a90,local_a90);
      dVar132 = local_7c0._0_8_;
      dVar9 = local_7c0._8_8_;
      dVar14 = local_7c0._16_8_;
      dVar21 = local_7c0._24_8_;
      dStack_1128 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 8) * 0.5;
      auVar83 = vmulpd_avx512vl(local_8c8,local_490);
      local_1160 = (dVar131 * dVar131 + local_968 * local_968 + auVar79._0_8_ + -1.0 +
                   local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] *
                   (auVar76._0_8_ + local_968 * local_530 + local_3c8 * dVar128)) * *pdVar63 *
                   dStack_1128;
      dStack_1158 = (dVar8 * dVar8 + dStack_960 * dStack_960 + auVar79._8_8_ + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar76._8_8_ + dStack_960 * dStack_528 + dStack_3c0 * dVar7)) * pdVar63[1] *
                    dStack_1128;
      dStack_1150 = (dVar13 * dVar13 + dStack_958 * dStack_958 + auVar79._16_8_ + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar76._16_8_ + dStack_958 * dStack_520 + dStack_3b8 * dVar12)) * pdVar63[2] *
                    dStack_1128;
      dStack_1148 = (dVar20 * dVar20 + dStack_950 * dStack_950 + auVar79._24_8_ + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar76._24_8_ + dStack_950 * dStack_518 + dStack_3b0 * dVar19)) * pdVar63[3] *
                    dStack_1128;
      local_1120 = (auVar82._0_8_ + local_928 * local_928 + dVar132 * dVar132 + -1.0 +
                   local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] *
                   (local_a90._0_8_ * local_658 + local_928 * local_4f0 + auVar78._0_8_)) *
                   pdVar63[8] * dStack_1128;
      dStack_1118 = (auVar82._8_8_ + dStack_920 * dStack_920 + dVar9 * dVar9 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (local_a90._8_8_ * dStack_650 + dStack_920 * dStack_4e8 + auVar78._8_8_)) *
                    pdVar63[9] * dStack_1128;
      dStack_1110 = (auVar82._16_8_ + dStack_918 * dStack_918 + dVar14 * dVar14 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (local_a90._16_8_ * dStack_648 + dStack_918 * dStack_4e0 + auVar78._16_8_)) *
                    pdVar63[10] * dStack_1128;
      dStack_1108 = (auVar82._24_8_ + dStack_910 * dStack_910 + dVar21 * dVar21 + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (local_a90._24_8_ * dStack_640 + dStack_910 * dStack_4d8 + auVar78._24_8_)) *
                    pdVar63[0xb] * dStack_1128;
      local_1140 = (local_ab0 * local_ab0 + local_948 * local_948 + auVar80._0_8_ + -1.0 +
                   local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] *
                   (local_ab0 * local_678 + local_948 * local_510 + auVar77._0_8_)) * pdVar63[4] *
                   dStack_1128;
      dStack_1138 = (dStack_aa8 * dStack_aa8 + dStack_940 * dStack_940 + auVar80._8_8_ + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (dStack_aa8 * dStack_670 + dStack_940 * dStack_508 + auVar77._8_8_)) *
                    pdVar63[5] * dStack_1128;
      dStack_1130 = (dStack_aa0 * dStack_aa0 + dStack_938 * dStack_938 + auVar80._16_8_ + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (dStack_aa0 * dStack_668 + dStack_938 * dStack_500 + auVar77._16_8_)) *
                    pdVar63[6] * dStack_1128;
      dStack_1128 = (dStack_a98 * dStack_a98 + dStack_930 * dStack_930 + auVar80._24_8_ + -1.0 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (dStack_a98 * dStack_660 + dStack_930 * dStack_4f8 + auVar77._24_8_)) *
                    pdVar63[7] * dStack_1128;
      auVar77 = vmulpd_avx512vl(local_a70,local_638);
      local_1580 = local_a70;
      dVar100 = local_908._0_8_;
      dVar106 = local_908._8_8_;
      dVar107 = local_908._16_8_;
      dVar108 = local_908._24_8_;
      auVar76 = vmulpd_avx512vl(local_908,local_908);
      local_1520 = local_908;
      dVar118 = local_7a0._0_8_;
      dVar10 = local_7a0._8_8_;
      dVar15 = local_7a0._16_8_;
      dVar22 = local_7a0._24_8_;
      auVar78 = vmulpd_avx512vl(local_8e8,local_4b0);
      local_1500 = local_8e8;
      local_1560 = local_a50;
      auVar99._0_8_ = local_a50._0_8_ * local_618._0_8_ + auVar78._0_8_;
      auVar99._8_8_ = local_a50._8_8_ * local_618._8_8_ + auVar78._8_8_;
      auVar99._16_8_ = local_a50._16_8_ * local_618._16_8_ + auVar78._16_8_;
      auVar99._24_8_ = local_a50._24_8_ * local_618._24_8_ + auVar78._24_8_;
      dVar6 = local_780._0_8_;
      auVar113._0_8_ = local_348 * dVar6;
      dVar11 = local_780._8_8_;
      auVar113._8_8_ = dStack_340 * dVar11;
      dVar16 = local_780._16_8_;
      auVar113._16_8_ = dStack_338 * dVar16;
      dVar23 = local_780._24_8_;
      auVar113._24_8_ = dStack_330 * dVar23;
      auVar78 = vaddpd_avx512vl(auVar99,auVar113);
      auVar123._0_8_ = local_a30._0_8_ * local_5f8;
      auVar123._8_8_ = local_a30._8_8_ * dStack_5f0;
      auVar123._16_8_ = local_a30._16_8_ * dStack_5e8;
      auVar123._24_8_ = local_a30._24_8_ * dStack_5e0;
      auVar79 = vmulpd_avx512vl(local_760,local_328);
      auVar80 = vmulpd_avx512vl(local_8e8,local_8e8);
      local_13a0 = local_a30;
      auVar82 = vaddpd_avx512vl(auVar123,auVar83);
      auVar79 = vaddpd_avx512vl(auVar82,auVar79);
      auVar82 = vmulpd_avx512vl(local_a70,local_a70);
      auVar76 = vaddpd_avx512vl(auVar82,auVar76);
      auVar82 = vmulpd_avx512vl(local_7a0,local_7a0);
      auVar76 = vaddpd_avx512vl(auVar76,auVar82);
      auVar82 = vmulpd_avx512vl(local_a50,local_a50);
      auVar80 = vaddpd_avx512vl(auVar82,auVar80);
      auVar82 = vmulpd_avx512vl(local_780,local_780);
      auVar127._0_8_ = auVar76._0_8_ + -1.0;
      auVar127._8_8_ = auVar76._8_8_ + -1.0;
      auVar127._16_8_ = auVar76._16_8_ + -1.0;
      auVar127._24_8_ = auVar76._24_8_ + -1.0;
      auVar76 = vaddpd_avx512vl(auVar80,auVar82);
      auVar80 = vmulpd_avx512vl(local_a30,local_a30);
      auVar80 = vaddpd_avx512vl(auVar80,auVar81);
      auVar81 = vmulpd_avx512vl(local_760,local_760);
      auVar103._0_8_ = auVar76._0_8_ + -1.0;
      auVar103._8_8_ = auVar76._8_8_ + -1.0;
      auVar103._16_8_ = auVar76._16_8_ + -1.0;
      auVar103._24_8_ = auVar76._24_8_ + -1.0;
      auVar80 = vaddpd_avx512vl(auVar80,auVar81);
      auVar129._8_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar129._0_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar129._16_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar129._24_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar76._8_8_ = auVar77._8_8_ + dVar106 * local_4d0._8_8_ + dStack_360 * dVar10;
      auVar76._0_8_ = auVar77._0_8_ + dVar100 * local_4d0._0_8_ + local_368 * dVar118;
      auVar76._16_8_ = auVar77._16_8_ + dVar107 * local_4d0._16_8_ + dStack_358 * dVar15;
      auVar76._24_8_ = auVar77._24_8_ + dVar108 * local_4d0._24_8_ + dStack_350 * dVar22;
      auVar76 = vmulpd_avx512vl(auVar129,auVar76);
      auVar77 = vmulpd_avx512vl(auVar129,auVar78);
      auVar79 = vmulpd_avx512vl(auVar129,auVar79);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = dVar124;
      dStack_1168 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x10) * 0.5;
      auVar77 = vaddpd_avx512vl(auVar103,auVar77);
      auVar76 = vaddpd_avx512vl(auVar127,auVar76);
      auVar78._8_8_ = dStack_960;
      auVar78._0_8_ = local_968;
      auVar78._16_8_ = dStack_958;
      auVar78._24_8_ = dStack_950;
      vmovsd_avx512f(auVar66);
      local_11a0 = dStack_1168 * auVar77._0_8_ * pdVar63[4];
      dStack_1198 = dStack_1168 * auVar77._8_8_ * pdVar63[5];
      dStack_1190 = dStack_1168 * auVar77._16_8_ * pdVar63[6];
      dStack_1188 = dStack_1168 * auVar77._24_8_ * pdVar63[7];
      local_11c0 = auVar76._0_8_ * *pdVar63 * dStack_1168;
      dStack_11b8 = auVar76._8_8_ * pdVar63[1] * dStack_1168;
      dStack_11b0 = auVar76._16_8_ * pdVar63[2] * dStack_1168;
      dStack_11a8 = auVar76._24_8_ * pdVar63[3] * dStack_1168;
      local_1180 = dStack_1168 * (auVar79._0_8_ + auVar80._0_8_ + -1.0) * pdVar63[8];
      dStack_1178 = dStack_1168 * (auVar79._8_8_ + auVar80._8_8_ + -1.0) * pdVar63[9];
      dStack_1170 = dStack_1168 * (auVar79._16_8_ + auVar80._16_8_ + -1.0) * pdVar63[10];
      dStack_1168 = dStack_1168 * (auVar79._24_8_ + auVar80._24_8_ + -1.0) * pdVar63[0xb];
      auVar90._8_8_ = dStack_528;
      auVar90._0_8_ = local_530;
      auVar90._16_8_ = dStack_520;
      auVar90._24_8_ = dStack_518;
      auVar76 = vmulpd_avx512vl(local_908,auVar90);
      local_16a0._0_8_ = local_7e0._0_8_;
      local_16a0._8_8_ = local_7e0._8_8_;
      auStack_1690._0_8_ = local_7e0._16_8_;
      auStack_1690._8_8_ = local_7e0._24_8_;
      auVar79 = vmulpd_avx512vl(local_698,local_a70);
      auVar93._8_8_ = dStack_940;
      auVar93._0_8_ = local_948;
      auVar93._16_8_ = dStack_938;
      auVar93._24_8_ = dStack_930;
      auVar80 = vmulpd_avx512vl(local_b30._96_32_,local_638);
      auVar82 = vmulpd_avx512vl(auVar78,local_4d0);
      auVar32._8_8_ = dStack_508;
      auVar32._0_8_ = local_510;
      auVar32._16_8_ = dStack_500;
      auVar32._24_8_ = dStack_4f8;
      auVar77 = vmulpd_avx512vl(local_8e8,auVar32);
      auVar88._8_8_ = dStack_670;
      auVar88._0_8_ = local_678;
      auVar88._16_8_ = dStack_668;
      auVar88._24_8_ = dStack_660;
      auVar83 = vmulpd_avx512vl(local_a50,auVar88);
      auVar84 = vmulpd_avx512vl(local_3a8,local_780);
      auVar81._8_8_ = dStack_aa8;
      auVar81._0_8_ = local_ab0;
      auVar81._16_8_ = dStack_aa0;
      auVar81._24_8_ = dStack_a98;
      auVar85 = vmulpd_avx512vl(auVar81,local_618);
      auVar86 = vmulpd_avx512vl(auVar93,local_4b0);
      auVar31._8_8_ = dStack_4e8;
      auVar31._0_8_ = local_4f0;
      auVar31._16_8_ = dStack_4e0;
      auVar31._24_8_ = dStack_4d8;
      auVar87 = vmulpd_avx512vl(local_8c8,auVar31);
      dStack_1758 = (double)local_16a0._8_8_ * dStack_340 +
                    auVar86._8_8_ + auVar85._8_8_ + auVar83._8_8_ + auVar77._8_8_ + auVar84._8_8_;
      local_1780._32_8_ =
           (double)local_16a0._0_8_ * local_348 +
           auVar86._0_8_ + auVar85._0_8_ + auVar83._0_8_ + auVar77._0_8_ + auVar84._0_8_;
      dStack_1750 = (double)auStack_1690._0_8_ * dStack_338 +
                    auVar86._16_8_ +
                    auVar85._16_8_ + auVar83._16_8_ + auVar77._16_8_ + auVar84._16_8_;
      dStack_1748 = (double)auStack_1690._8_8_ * dStack_330 +
                    auVar86._24_8_ +
                    auVar85._24_8_ + auVar83._24_8_ + auVar77._24_8_ + auVar84._24_8_;
      auVar91._8_8_ = dStack_650;
      auVar91._0_8_ = local_658;
      auVar91._16_8_ = dStack_648;
      auVar91._24_8_ = dStack_640;
      auVar83 = vmulpd_avx512vl(local_a30,auVar91);
      auVar84 = vmulpd_avx512vl(local_388,local_760);
      auVar48._8_8_ = dStack_420;
      auVar48._0_8_ = local_428;
      auVar48._16_8_ = dStack_418;
      auVar48._24_8_ = dStack_410;
      local_1360 = local_7a0;
      auVar97._8_8_ = dStack_920;
      auVar97._0_8_ = local_928;
      auVar97._16_8_ = dStack_918;
      auVar97._24_8_ = dStack_910;
      local_12e0 = local_760;
      auVar85 = vmulpd_avx512vl(local_7c0,local_328);
      auVar77 = vmulpd_avx512vl(auVar78,local_908);
      auVar78 = vmulpd_avx512vl(local_b30._96_32_,local_a70);
      local_1340 = local_780;
      auVar86 = vmulpd_avx512vl(auVar93,local_8e8);
      auVar51._8_8_ = dStack_588;
      auVar51._0_8_ = local_590;
      auVar51._16_8_ = dStack_580;
      auVar51._24_8_ = dStack_578;
      auVar95._8_8_ = local_b30._8_8_;
      auVar95._0_8_ = local_b30._0_8_;
      auVar95._16_8_ = local_b30._16_8_;
      auVar95._24_8_ = local_b30._24_8_;
      auVar104._0_8_ = auVar78._0_8_ + auVar77._0_8_ + dVar128 * dVar118;
      auVar104._8_8_ = auVar78._8_8_ + auVar77._8_8_ + dVar7 * dVar10;
      auVar104._16_8_ = auVar78._16_8_ + auVar77._16_8_ + dVar12 * dVar15;
      auVar104._24_8_ = auVar78._24_8_ + auVar77._24_8_ + dVar19 * dVar22;
      auVar77 = vmulpd_avx512vl(auVar81,local_a50);
      auVar53._8_8_ = dStack_6f0;
      auVar53._0_8_ = local_6f8;
      auVar53._16_8_ = dStack_6e8;
      auVar53._24_8_ = dStack_6e0;
      auVar78 = vmulpd_avx512vl(auVar97,local_8c8);
      auVar109._0_8_ = (double)local_16a0._0_8_ * dVar6 + auVar86._0_8_ + auVar77._0_8_;
      auVar109._8_8_ = (double)local_16a0._8_8_ * dVar11 + auVar86._8_8_ + auVar77._8_8_;
      auVar109._16_8_ = (double)auStack_1690._0_8_ * dVar16 + auVar86._16_8_ + auVar77._16_8_;
      auVar109._24_8_ = (double)auStack_1690._8_8_ * dVar23 + auVar86._24_8_ + auVar77._24_8_;
      auVar81 = vmulpd_avx512vl(local_a90,local_a30);
      auVar35._8_8_ = dStack_858;
      auVar35._0_8_ = local_860;
      auVar35._16_8_ = dStack_850;
      auVar35._24_8_ = dStack_848;
      auVar86 = vmulpd_avx512vl(local_7c0,local_760);
      auVar34._8_8_ = dStack_9c0;
      auVar34._0_8_ = local_9c8;
      auVar34._16_8_ = dStack_9b8;
      auVar34._24_8_ = dStack_9b0;
      auVar55._8_8_ = dStack_6b0;
      auVar55._0_8_ = local_6b8;
      auVar55._16_8_ = dStack_6a8;
      auVar55._24_8_ = dStack_6a0;
      auVar130._8_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar130._0_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar130._16_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar130._24_8_ =
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0];
      auVar77._8_8_ =
           dVar7 * dStack_360 +
           auVar82._8_8_ + auVar80._8_8_ + auVar79._8_8_ + auVar76._8_8_ + dStack_3c0 * dVar10;
      auVar77._0_8_ =
           dVar128 * local_368 +
           auVar82._0_8_ + auVar80._0_8_ + auVar79._0_8_ + auVar76._0_8_ + local_3c8 * dVar118;
      auVar77._16_8_ =
           dVar12 * dStack_358 +
           auVar82._16_8_ + auVar80._16_8_ + auVar79._16_8_ + auVar76._16_8_ + dStack_3b8 * dVar15;
      auVar77._24_8_ =
           dVar19 * dStack_350 +
           auVar82._24_8_ + auVar80._24_8_ + auVar79._24_8_ + auVar76._24_8_ + dStack_3b0 * dVar22;
      auVar76 = vmulpd_avx512vl(auVar130,auVar77);
      auVar76 = vaddpd_avx512vl(auVar104,auVar76);
      auVar77 = vmulpd_avx512vl(auVar130,stack0xffffffffffffe8a0);
      dStack_11e8 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x18);
      auVar77 = vaddpd_avx512vl(auVar109,auVar77);
      auVar50._8_8_ = dStack_568;
      auVar50._0_8_ = local_570;
      auVar50._16_8_ = dStack_560;
      auVar50._24_8_ = dStack_558;
      vmovsd_avx512f(auVar66);
      local_1240 = dStack_11e8 * auVar76._0_8_ * *pdVar63;
      dStack_1238 = dStack_11e8 * auVar76._8_8_ * pdVar63[1];
      dStack_1230 = dStack_11e8 * auVar76._16_8_ * pdVar63[2];
      dStack_1228 = dStack_11e8 * auVar76._24_8_ * pdVar63[3];
      local_1220 = dStack_11e8 * auVar77._0_8_ * pdVar63[4];
      dStack_1218 = dStack_11e8 * auVar77._8_8_ * pdVar63[5];
      dStack_1210 = dStack_11e8 * auVar77._16_8_ * pdVar63[6];
      dStack_1208 = dStack_11e8 * auVar77._24_8_ * pdVar63[7];
      auVar76 = vmulpd_avx512vl(auVar51,local_908);
      local_1200 = (auVar81._0_8_ + auVar78._0_8_ + auVar86._0_8_ +
                   local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                   m_storage.m_data.array[0] *
                   (auVar85._0_8_ +
                   local_928 * local_490._0_8_ +
                   local_a90._0_8_ * local_5f8 + auVar83._0_8_ + auVar87._0_8_ + auVar84._0_8_)) *
                   pdVar63[8] * dStack_11e8;
      dStack_11f8 = (auVar81._8_8_ + auVar78._8_8_ + auVar86._8_8_ +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar85._8_8_ +
                    dStack_920 * local_490._8_8_ +
                    local_a90._8_8_ * dStack_5f0 + auVar83._8_8_ + auVar87._8_8_ + auVar84._8_8_)) *
                    pdVar63[9] * dStack_11e8;
      dStack_11f0 = (auVar81._16_8_ + auVar78._16_8_ + auVar86._16_8_ +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar85._16_8_ +
                    dStack_918 * local_490._16_8_ +
                    local_a90._16_8_ * dStack_5e8 + auVar83._16_8_ + auVar87._16_8_ + auVar84._16_8_
                    )) * pdVar63[10] * dStack_11e8;
      dStack_11e8 = (auVar81._24_8_ + auVar78._24_8_ + auVar86._24_8_ +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar85._24_8_ +
                    dStack_910 * local_490._24_8_ +
                    local_a90._24_8_ * dStack_5e0 + auVar83._24_8_ + auVar87._24_8_ + auVar84._24_8_
                    )) * pdVar63[0xb] * dStack_11e8;
      auVar28._8_8_ = dStack_9a0;
      auVar28._0_8_ = local_9a8;
      auVar28._16_8_ = dStack_998;
      auVar28._24_8_ = dStack_990;
      auVar39._8_8_ = local_b30._72_8_;
      auVar39._0_8_ = local_b30._64_8_;
      auVar39._16_8_ = local_b30._80_8_;
      auVar39._24_8_ = local_b30._88_8_;
      auVar77 = vmulpd_avx512vl(auVar53,local_a70);
      auVar78 = vmulpd_avx512vl(auVar48,local_7a0);
      auVar79 = vmulpd_avx512vl(auVar95,local_638);
      auVar47._8_8_ = dStack_400;
      auVar47._0_8_ = local_408;
      auVar47._16_8_ = dStack_3f8;
      auVar47._24_8_ = dStack_3f0;
      auVar54._8_8_ = dStack_6d0;
      auVar54._0_8_ = local_6d8;
      auVar54._16_8_ = dStack_6c8;
      auVar54._24_8_ = dStack_6c0;
      auVar85._8_8_ = dStack_818;
      auVar85._0_8_ = local_820;
      auVar85._16_8_ = dStack_810;
      auVar85._24_8_ = dStack_808;
      auVar80 = vmulpd_avx512vl(auVar50,local_8e8);
      auVar81 = vmulpd_avx512vl(auVar54,local_a50);
      auVar52._8_8_ = dStack_548;
      auVar52._0_8_ = local_550;
      auVar52._16_8_ = dStack_540;
      auVar52._24_8_ = dStack_538;
      auVar82 = vmulpd_avx512vl(auVar47,local_780);
      auVar84._8_8_ = local_b30._40_8_;
      auVar84._0_8_ = local_b30._32_8_;
      auVar84._16_8_ = local_b30._48_8_;
      auVar84._24_8_ = local_b30._56_8_;
      auVar83 = vmulpd_avx512vl(auVar84,local_618);
      auVar86 = vmulpd_avx512vl(auVar28,local_4b0);
      auVar49._8_8_ = dStack_3e0;
      auVar49._0_8_ = local_3e8;
      auVar49._16_8_ = dStack_3d8;
      auVar49._24_8_ = dStack_3d0;
      auVar30._8_8_ = dStack_980;
      auVar30._0_8_ = local_988;
      auVar30._16_8_ = dStack_978;
      auVar30._24_8_ = dStack_970;
      auVar87 = vmulpd_avx512vl(auVar52,local_8c8);
      auVar88 = vmulpd_avx512vl(auVar55,local_a30);
      auVar89 = vmulpd_avx512vl(auVar49,local_760);
      auVar90 = vmulpd_avx512vl(auVar85,local_328);
      auVar91 = vmulpd_avx512vl(auVar34,local_908);
      auVar92 = vmulpd_avx512vl(auVar28,local_8e8);
      auVar93 = vmulpd_avx512vl(auVar95,local_a70);
      auVar94 = vmulpd_avx512vl(auVar35,local_7a0);
      auVar95 = vmulpd_avx512vl(auVar84,local_a50);
      auVar96 = vmulpd_avx512vl(auVar30,local_8c8);
      auVar97 = vmulpd_avx512vl(auVar39,local_a30);
      dVar7 = local_760._0_8_;
      dVar12 = local_760._8_8_;
      dVar17 = local_760._16_8_;
      dVar24 = local_760._24_8_;
      auVar105._0_8_ =
           (auVar93._0_8_ + auVar91._0_8_ + auVar94._0_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (local_860 * local_368 +
           local_9c8 * local_4d0._0_8_ +
           auVar79._0_8_ + auVar77._0_8_ + auVar76._0_8_ + auVar78._0_8_)) * *pdVar63;
      auVar105._8_8_ =
           (auVar93._8_8_ + auVar91._8_8_ + auVar94._8_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_858 * dStack_360 +
           dStack_9c0 * local_4d0._8_8_ +
           auVar79._8_8_ + auVar77._8_8_ + auVar76._8_8_ + auVar78._8_8_)) * pdVar63[1];
      auVar105._16_8_ =
           (auVar93._16_8_ + auVar91._16_8_ + auVar94._16_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_850 * dStack_358 +
           dStack_9b8 * local_4d0._16_8_ +
           auVar79._16_8_ + auVar77._16_8_ + auVar76._16_8_ + auVar78._16_8_)) * pdVar63[2];
      auVar105._24_8_ =
           (auVar93._24_8_ + auVar91._24_8_ + auVar94._24_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_848 * dStack_350 +
           dStack_9b0 * local_4d0._24_8_ +
           auVar79._24_8_ + auVar77._24_8_ + auVar76._24_8_ + auVar78._24_8_)) * pdVar63[3];
      auVar110._0_8_ =
           (auVar95._0_8_ + auVar92._0_8_ + local_840 * dVar6 +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (local_348 * local_840 +
           auVar86._0_8_ + auVar83._0_8_ + auVar81._0_8_ + auVar80._0_8_ + auVar82._0_8_)) *
           pdVar63[4];
      auVar110._8_8_ =
           (auVar95._8_8_ + auVar92._8_8_ + dStack_838 * dVar11 +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_340 * dStack_838 +
           auVar86._8_8_ + auVar83._8_8_ + auVar81._8_8_ + auVar80._8_8_ + auVar82._8_8_)) *
           pdVar63[5];
      auVar110._16_8_ =
           (auVar95._16_8_ + auVar92._16_8_ + dStack_830 * dVar16 +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_338 * dStack_830 +
           auVar86._16_8_ + auVar83._16_8_ + auVar81._16_8_ + auVar80._16_8_ + auVar82._16_8_)) *
           pdVar63[6];
      auVar110._24_8_ =
           (auVar95._24_8_ + auVar92._24_8_ + dStack_828 * dVar23 +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (dStack_330 * dStack_828 +
           auVar86._24_8_ + auVar83._24_8_ + auVar81._24_8_ + auVar80._24_8_ + auVar82._24_8_)) *
           pdVar63[7];
      dStack_1628 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x20);
      auVar114._8_8_ = dStack_1628;
      auVar114._0_8_ = dStack_1628;
      auVar114._16_8_ = dStack_1628;
      auVar114._24_8_ = dStack_1628;
      auVar79._8_8_ = dStack_960;
      auVar79._0_8_ = local_968;
      auVar79._16_8_ = dStack_958;
      auVar79._24_8_ = dStack_950;
      vmovsd_avx512f(auVar66);
      auVar46._8_8_ = dStack_10b8;
      auVar46._0_8_ = local_10c0;
      auVar46._16_8_ = dStack_10b0;
      auVar46._24_8_ = dStack_10a8;
      local_15c0 = vmulpd_avx512vl(auVar105,auVar114);
      auVar44._8_8_ = dStack_10f8;
      auVar44._0_8_ = local_1100;
      auVar44._16_8_ = dStack_10f0;
      auVar44._24_8_ = dStack_10e8;
      local_13c0 = vmulpd_avx512vl(auVar110,auVar114);
      local_1640._0_8_ =
           (auVar97._0_8_ + auVar96._0_8_ + local_820 * dVar7 +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (auVar90._0_8_ +
           local_988 * local_490._0_8_ +
           (double)local_b30._64_8_ * local_5f8 + auVar88._0_8_ + auVar87._0_8_ + auVar89._0_8_)) *
           pdVar63[8] * dStack_1628;
      local_1640._8_8_ =
           (auVar97._8_8_ + auVar96._8_8_ + dStack_818 * dVar12 +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] *
           (auVar90._8_8_ +
           dStack_980 * local_490._8_8_ +
           (double)local_b30._72_8_ * dStack_5f0 + auVar88._8_8_ + auVar87._8_8_ + auVar89._8_8_)) *
           pdVar63[9] * dStack_1628;
      dStack_1630 = (auVar97._16_8_ + auVar96._16_8_ + dStack_810 * dVar17 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar90._16_8_ +
                    dStack_978 * local_490._16_8_ +
                    (double)local_b30._80_8_ * dStack_5e8 +
                    auVar88._16_8_ + auVar87._16_8_ + auVar89._16_8_)) * pdVar63[10] * dStack_1628;
      dStack_1628 = (auVar97._24_8_ + auVar96._24_8_ + dStack_808 * dVar24 +
                    local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                    m_storage.m_data.array[0] *
                    (auVar90._24_8_ +
                    dStack_970 * local_490._24_8_ +
                    (double)local_b30._88_8_ * dStack_5e0 +
                    auVar88._24_8_ + auVar87._24_8_ + auVar89._24_8_)) * pdVar63[0xb] * dStack_1628;
      auVar76 = vmulpd_avx512vl(auVar53,local_b30._96_32_);
      auVar82._8_8_ = dStack_aa8;
      auVar82._0_8_ = local_ab0;
      auVar82._16_8_ = dStack_aa0;
      auVar82._24_8_ = dStack_a98;
      auVar77 = vmulpd_avx512vl(auVar48,local_800);
      local_1320._0_8_ = local_698._0_8_;
      local_1320._8_8_ = local_698._8_8_;
      dStack_1310 = local_698._16_8_;
      dStack_1308 = local_698._24_8_;
      local_1780._0_8_ =
           local_860 * local_3c8 +
           local_9c8 * local_530 +
           (double)local_b30._0_8_ * (double)local_1320._0_8_ +
           auVar76._0_8_ + local_590 * local_968 + auVar77._0_8_;
      local_1780._8_8_ =
           dStack_858 * dStack_3c0 +
           dStack_9c0 * dStack_528 +
           (double)local_b30._8_8_ * (double)local_1320._8_8_ +
           auVar76._8_8_ + dStack_588 * dStack_960 + auVar77._8_8_;
      local_1780._16_8_ =
           dStack_850 * dStack_3b8 +
           dStack_9b8 * dStack_520 +
           (double)local_b30._16_8_ * dStack_1310 +
           auVar76._16_8_ + dStack_580 * dStack_958 + auVar77._16_8_;
      local_1780._24_8_ =
           dStack_848 * dStack_3b0 +
           dStack_9b0 * dStack_518 +
           (double)local_b30._24_8_ * dStack_1308 +
           auVar76._24_8_ + dStack_578 * dStack_950 + auVar77._24_8_;
      auVar94._8_8_ = dStack_940;
      auVar94._0_8_ = local_948;
      auVar94._16_8_ = dStack_938;
      auVar94._24_8_ = dStack_930;
      auVar76 = vmulpd_avx512vl(auVar50,auVar94);
      auVar77 = vmulpd_avx512vl(auVar47,local_7e0);
      auVar26._8_8_ = dStack_920;
      auVar26._0_8_ = local_928;
      auVar26._16_8_ = dStack_918;
      auVar26._24_8_ = dStack_910;
      auVar89._8_8_ = dStack_670;
      auVar89._0_8_ = local_678;
      auVar89._16_8_ = dStack_668;
      auVar89._24_8_ = dStack_660;
      auVar78 = vmulpd_avx512vl(auVar84,auVar89);
      auVar33._8_8_ = dStack_508;
      auVar33._0_8_ = local_510;
      auVar33._16_8_ = dStack_500;
      auVar33._24_8_ = dStack_4f8;
      auVar80 = vmulpd_avx512vl(auVar28,auVar33);
      local_12a0._0_8_ = local_3a8._0_8_;
      local_12a0._8_8_ = local_3a8._8_8_;
      dStack_1290 = local_3a8._16_8_;
      dStack_1288 = local_3a8._24_8_;
      local_1780._32_8_ =
           local_840 * (double)local_12a0._0_8_ +
           auVar80._0_8_ + auVar78._0_8_ + local_ab0 * local_6d8 + auVar76._0_8_ + auVar77._0_8_;
      dStack_1758 = dStack_838 * (double)local_12a0._8_8_ +
                    auVar80._8_8_ +
                    auVar78._8_8_ + dStack_aa8 * dStack_6d0 + auVar76._8_8_ + auVar77._8_8_;
      dStack_1750 = dStack_830 * dStack_1290 +
                    auVar80._16_8_ +
                    auVar78._16_8_ + dStack_aa0 * dStack_6c8 + auVar76._16_8_ + auVar77._16_8_;
      dStack_1748 = dStack_828 * dStack_1288 +
                    auVar80._24_8_ +
                    auVar78._24_8_ + dStack_a98 * dStack_6c0 + auVar76._24_8_ + auVar77._24_8_;
      auVar76 = vmulpd_avx512vl(auVar52,auVar26);
      auVar77 = vmulpd_avx512vl(auVar55,local_a90);
      auVar78 = vmulpd_avx512vl(auVar49,local_7c0);
      auVar92._8_8_ = dStack_650;
      auVar92._0_8_ = local_658;
      auVar92._16_8_ = dStack_648;
      auVar92._24_8_ = dStack_640;
      auVar80 = vmulpd_avx512vl(auVar39,auVar92);
      local_12c0._0_8_ = local_388._0_8_;
      local_12c0._8_8_ = local_388._8_8_;
      dStack_12b0 = local_388._16_8_;
      dStack_12a8 = local_388._24_8_;
      local_1740 = local_820 * (double)local_12c0._0_8_ +
                   local_988 * local_4f0 +
                   auVar80._0_8_ + auVar77._0_8_ + auVar76._0_8_ + auVar78._0_8_;
      dStack_1738 = dStack_818 * (double)local_12c0._8_8_ +
                    dStack_980 * dStack_4e8 +
                    auVar80._8_8_ + auVar77._8_8_ + auVar76._8_8_ + auVar78._8_8_;
      dStack_1730 = dStack_810 * dStack_12b0 +
                    dStack_978 * dStack_4e0 +
                    auVar80._16_8_ + auVar77._16_8_ + auVar76._16_8_ + auVar78._16_8_;
      dStack_1728 = dStack_808 * dStack_12a8 +
                    dStack_970 * dStack_4d8 +
                    auVar80._24_8_ + auVar77._24_8_ + auVar76._24_8_ + auVar78._24_8_;
      auVar76 = vmulpd_avx512vl(auVar28,auVar94);
      auVar77 = vmulpd_avx512vl(auVar30,auVar26);
      auVar78 = vmulpd_avx512vl(auVar85,local_7c0);
      auVar80 = vmulpd_avx512vl(auVar35,local_800);
      auVar81 = vmulpd_avx512vl(auVar84,auVar82);
      auVar45._8_8_ = dStack_10d8;
      auVar45._0_8_ = local_10e0;
      auVar45._16_8_ = dStack_10d0;
      auVar45._24_8_ = dStack_10c8;
      auVar82 = vmulpd_avx512vl(auVar39,local_a90);
      dVar128 = *(double *)
                 ((long)(peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 0x28);
      auVar117._0_8_ =
           ((double)local_b30._0_8_ * dVar131 + local_9c8 * local_968 + auVar80._0_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1780._0_8_) * *pdVar63 * dVar128;
      auVar117._8_8_ =
           ((double)local_b30._8_8_ * dVar8 + dStack_9c0 * dStack_960 + auVar80._8_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1780._8_8_) * pdVar63[1] * dVar128;
      auVar117._16_8_ =
           ((double)local_b30._16_8_ * dVar13 + dStack_9b8 * dStack_958 + auVar80._16_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1780._16_8_) * pdVar63[2] * dVar128;
      auVar117._24_8_ =
           ((double)local_b30._24_8_ * dVar20 + dStack_9b0 * dStack_950 + auVar80._24_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1780._24_8_) * pdVar63[3] * dVar128;
      auVar111._0_8_ =
           (auVar82._0_8_ + auVar77._0_8_ + auVar78._0_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * local_1740) * pdVar63[8] * dVar128;
      auVar111._8_8_ =
           (auVar82._8_8_ + auVar77._8_8_ + auVar78._8_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_1738) * pdVar63[9] * dVar128;
      auVar111._16_8_ =
           (auVar82._16_8_ + auVar77._16_8_ + auVar78._16_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_1730) * pdVar63[10] * dVar128;
      auVar111._24_8_ =
           (auVar82._24_8_ + auVar77._24_8_ + auVar78._24_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_1728) * pdVar63[0xb] * dVar128;
      auVar115._0_8_ =
           (auVar81._0_8_ + auVar76._0_8_ + local_840 * (double)local_16a0._0_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * (double)local_1780._32_8_) * pdVar63[4] * dVar128;
      auVar115._8_8_ =
           (auVar81._8_8_ + auVar76._8_8_ + dStack_838 * (double)local_16a0._8_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_1758) * pdVar63[5] * dVar128;
      auVar115._16_8_ =
           (auVar81._16_8_ + auVar76._16_8_ + dStack_830 * (double)auStack_1690._0_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_1750) * pdVar63[6] * dVar128;
      auVar115._24_8_ =
           (auVar81._24_8_ + auVar76._24_8_ + dStack_828 * (double)auStack_1690._8_8_ +
           local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
           .array[0] * dStack_1748) * pdVar63[7] * dVar128;
      auVar76 = vmulpd_avx512vl(local_a70,local_15c0);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0] = auVar76._0_8_ + (double)local_b30._0_8_ * local_1100 + dVar131 * auVar117._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[1] = auVar76._8_8_ + (double)local_b30._8_8_ * dStack_10f8 + dVar8 * auVar117._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[2] = auVar76._16_8_ + (double)local_b30._16_8_ * dStack_10f0 + dVar13 * auVar117._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[3] = auVar76._24_8_ + (double)local_b30._24_8_ * dStack_10e8 + dVar20 * auVar117._24_8_;
      auVar76 = vmulpd_avx512vl(auVar84,auVar45);
      auVar77 = vmulpd_avx512vl(local_a50,local_13c0);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[4] = auVar77._0_8_ + auVar76._0_8_ + local_ab0 * auVar115._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[5] = auVar77._8_8_ + auVar76._8_8_ + dStack_aa8 * auVar115._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[6] = auVar77._16_8_ + auVar76._16_8_ + dStack_aa0 * auVar115._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[7] = auVar77._24_8_ + auVar76._24_8_ + dStack_a98 * auVar115._24_8_;
      auVar76 = vmulpd_avx512vl(local_a90,auVar111);
      auVar77 = vmulpd_avx512vl(auVar39,auVar46);
      auVar78 = vmulpd_avx512vl(local_a30,_local_1640);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[8] = auVar78._0_8_ + auVar77._0_8_ + auVar76._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[9] = auVar78._8_8_ + auVar77._8_8_ + auVar76._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[10] = auVar78._16_8_ + auVar77._16_8_ + auVar76._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xb] = auVar78._24_8_ + auVar77._24_8_ + auVar76._24_8_;
      auVar76 = vmulpd_avx512vl(auVar79,auVar117);
      auVar77 = vmulpd_avx512vl(auVar34,auVar44);
      auVar78 = vmulpd_avx512vl(local_908,local_15c0);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2d] = auVar78._0_8_ + auVar77._0_8_ + auVar76._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2e] = auVar78._8_8_ + auVar77._8_8_ + auVar76._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2f] = auVar78._16_8_ + auVar77._16_8_ + auVar76._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x30] = auVar78._24_8_ + auVar77._24_8_ + auVar76._24_8_;
      auVar76 = vmulpd_avx512vl(auVar28,auVar45);
      auVar77 = vmulpd_avx512vl(local_8e8,local_13c0);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x31] = auVar77._0_8_ + auVar76._0_8_ + local_948 * auVar115._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x32] = auVar77._8_8_ + auVar76._8_8_ + dStack_940 * auVar115._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x33] = auVar77._16_8_ + auVar76._16_8_ + dStack_938 * auVar115._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x34] = auVar77._24_8_ + auVar76._24_8_ + dStack_930 * auVar115._24_8_;
      auVar76 = vmulpd_avx512vl(auVar26,auVar111);
      auVar77 = vmulpd_avx512vl(auVar30,auVar46);
      auVar38._8_8_ = dStack_11f8;
      auVar38._0_8_ = local_1200;
      auVar38._16_8_ = dStack_11f0;
      auVar38._24_8_ = dStack_11e8;
      auVar78 = vmulpd_avx512vl(local_8c8,_local_1640);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x35] = auVar78._0_8_ + auVar77._0_8_ + auVar76._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x36] = auVar78._8_8_ + auVar77._8_8_ + auVar76._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x37] = auVar78._16_8_ + auVar77._16_8_ + auVar76._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x38] = auVar78._24_8_ + auVar77._24_8_ + auVar76._24_8_;
      auVar76 = vmulpd_avx512vl(local_800,auVar117);
      auVar77 = vmulpd_avx512vl(auVar35,auVar44);
      auVar27._8_8_ = dStack_838;
      auVar27._0_8_ = local_840;
      auVar27._16_8_ = dStack_830;
      auVar27._24_8_ = dStack_828;
      auVar42._8_8_ = dStack_1138;
      auVar42._0_8_ = local_1140;
      auVar42._16_8_ = dStack_1130;
      auVar42._24_8_ = dStack_1128;
      auVar78 = vmulpd_avx512vl(local_7a0,local_15c0);
      auVar96._8_8_ = local_b30._8_8_;
      auVar96._0_8_ = local_b30._0_8_;
      auVar96._16_8_ = local_b30._16_8_;
      auVar96._24_8_ = local_b30._24_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5a] = auVar78._0_8_ + auVar77._0_8_ + auVar76._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5b] = auVar78._8_8_ + auVar77._8_8_ + auVar76._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5c] = auVar78._16_8_ + auVar77._16_8_ + auVar76._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5d] = auVar78._24_8_ + auVar77._24_8_ + auVar76._24_8_;
      auVar76 = vmulpd_avx512vl(local_7e0,auVar115);
      auVar77 = vmulpd_avx512vl(auVar27,auVar45);
      auVar43._8_8_ = dStack_1118;
      auVar43._0_8_ = local_1120;
      auVar43._16_8_ = dStack_1110;
      auVar43._24_8_ = dStack_1108;
      dVar128 = local_13c0._0_8_;
      dVar19 = local_13c0._8_8_;
      dVar18 = local_13c0._16_8_;
      dVar25 = local_13c0._24_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5e] = dVar6 * dVar128 + auVar77._0_8_ + auVar76._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5f] = dVar11 * dVar19 + auVar77._8_8_ + auVar76._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x60] = dVar16 * dVar18 + auVar77._16_8_ + auVar76._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x61] = dVar23 * dVar25 + auVar77._24_8_ + auVar76._24_8_;
      auVar86._8_8_ = dStack_818;
      auVar86._0_8_ = local_820;
      auVar86._16_8_ = dStack_810;
      auVar86._24_8_ = dStack_808;
      auVar76 = vmulpd_avx512vl(auVar46,auVar86);
      auVar41._8_8_ = dStack_1158;
      auVar41._0_8_ = local_1160;
      auVar41._16_8_ = dStack_1150;
      auVar41._24_8_ = dStack_1148;
      auVar77 = vmulpd_avx512vl(local_760,_local_1640);
      auVar83._8_8_ = dStack_aa8;
      auVar83._0_8_ = local_ab0;
      auVar83._16_8_ = dStack_aa0;
      auVar83._24_8_ = dStack_a98;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x62] = auVar77._0_8_ + auVar76._0_8_ + auVar111._0_8_ * dVar132;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[99] = auVar77._8_8_ + auVar76._8_8_ + auVar111._8_8_ * dVar9;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[100] = auVar77._16_8_ + auVar76._16_8_ + auVar111._16_8_ * dVar14;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x65] = auVar77._24_8_ + auVar76._24_8_ + auVar111._24_8_ * dVar21;
      auVar76 = vmulpd_avx512vl(local_b30._96_32_,auVar41);
      auVar36._8_8_ = dStack_1238;
      auVar36._0_8_ = local_1240;
      auVar36._16_8_ = dStack_1230;
      auVar36._24_8_ = dStack_1228;
      auVar77 = vmulpd_avx512vl(auVar96,auVar117);
      auVar37._8_8_ = dStack_1218;
      auVar37._0_8_ = local_1220;
      auVar37._16_8_ = dStack_1210;
      auVar37._24_8_ = dStack_1208;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xc] = local_a70._0_8_ * local_1240 + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xd] = local_a70._8_8_ * dStack_1238 + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xe] = local_a70._16_8_ * dStack_1230 + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xf] = local_a70._24_8_ * dStack_1228 + auVar76._24_8_ + auVar77._24_8_;
      auVar76 = vmulpd_avx512vl(auVar83,auVar42);
      auVar77 = vmulpd_avx512vl(local_a50,auVar37);
      auVar29._8_8_ = dStack_9a0;
      auVar29._0_8_ = local_9a8;
      auVar29._16_8_ = dStack_998;
      auVar29._24_8_ = dStack_990;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x10] = auVar77._0_8_ + auVar76._0_8_ + auVar115._0_8_ * (double)local_b30._32_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x11] = auVar77._8_8_ + auVar76._8_8_ + auVar115._8_8_ * (double)local_b30._40_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x12] = auVar77._16_8_ + auVar76._16_8_ + auVar115._16_8_ * (double)local_b30._48_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x13] = auVar77._24_8_ + auVar76._24_8_ + auVar115._24_8_ * (double)local_b30._56_8_;
      auVar76 = vmulpd_avx512vl(local_a90,auVar43);
      auVar77 = vmulpd_avx512vl(auVar39,auVar111);
      auVar78 = vmulpd_avx512vl(local_a30,auVar38);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x14] = auVar78._0_8_ + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x15] = auVar78._8_8_ + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x16] = auVar78._16_8_ + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x17] = auVar78._24_8_ + auVar76._24_8_ + auVar77._24_8_;
      auVar76 = vmulpd_avx512vl(auVar79,auVar41);
      auVar87._8_8_ = dStack_818;
      auVar87._0_8_ = local_820;
      auVar87._16_8_ = dStack_810;
      auVar87._24_8_ = dStack_808;
      auVar77 = vmulpd_avx512vl(auVar34,auVar117);
      auVar78 = vmulpd_avx512vl(auVar35,auVar117);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x39] = dVar100 * local_1240 + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3a] = dVar106 * dStack_1238 + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3b] = dVar107 * dStack_1230 + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3c] = dVar108 * dStack_1228 + auVar76._24_8_ + auVar77._24_8_;
      auVar76 = vmulpd_avx512vl(auVar94,auVar42);
      auVar77 = vmulpd_avx512vl(auVar29,auVar115);
      auVar79 = vmulpd_avx512vl(auVar27,auVar115);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3d] = local_8e8._0_8_ * local_1220 + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3e] = local_8e8._8_8_ * dStack_1218 + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3f] = local_8e8._16_8_ * dStack_1210 + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x40] = local_8e8._24_8_ * dStack_1208 + auVar76._24_8_ + auVar77._24_8_;
      auVar76 = vmulpd_avx512vl(auVar26,auVar43);
      auVar77 = vmulpd_avx512vl(auVar30,auVar111);
      auVar80 = vmulpd_avx512vl(auVar87,auVar111);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x41] = local_8c8._0_8_ * local_1200 + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x42] = local_8c8._8_8_ * dStack_11f8 + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x43] = local_8c8._16_8_ * dStack_11f0 + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x44] = local_8c8._24_8_ * dStack_11e8 + auVar76._24_8_ + auVar77._24_8_;
      auVar76 = vmulpd_avx512vl(local_800,auVar41);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x66] = dVar118 * local_1240 + auVar76._0_8_ + auVar78._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x67] = dVar10 * dStack_1238 + auVar76._8_8_ + auVar78._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x68] = dVar15 * dStack_1230 + auVar76._16_8_ + auVar78._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x69] = dVar22 * dStack_1228 + auVar76._24_8_ + auVar78._24_8_;
      auVar76 = vmulpd_avx512vl(local_7e0,auVar42);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6a] = dVar6 * local_1220 + auVar76._0_8_ + auVar79._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6b] = dVar11 * dStack_1218 + auVar76._8_8_ + auVar79._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6c] = dVar16 * dStack_1210 + auVar76._16_8_ + auVar79._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6d] = dVar23 * dStack_1208 + auVar76._24_8_ + auVar79._24_8_;
      auVar76 = vmulpd_avx512vl(local_7c0,auVar43);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6e] = dVar7 * local_1200 + auVar76._0_8_ + auVar80._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6f] = dVar12 * dStack_11f8 + auVar76._8_8_ + auVar80._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x70] = dVar17 * dStack_11f0 + auVar76._16_8_ + auVar80._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x71] = dVar24 * dStack_11e8 + auVar76._24_8_ + auVar80._24_8_;
      auVar76 = vmulpd_avx512vl(auVar96,local_15c0);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x18] = local_11c0 * local_a70._0_8_ + local_1240 * dVar131 + auVar76._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x19] = dStack_11b8 * local_a70._8_8_ + dStack_1238 * dVar8 + auVar76._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1a] = dStack_11b0 * local_a70._16_8_ + dStack_1230 * dVar13 + auVar76._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1b] = dStack_11a8 * local_a70._24_8_ + dStack_1228 * dVar20 + auVar76._24_8_;
      auVar76 = vmulpd_avx512vl(auVar83,auVar37);
      auVar40._8_8_ = dStack_1178;
      auVar40._0_8_ = local_1180;
      auVar40._16_8_ = dStack_1170;
      auVar40._24_8_ = dStack_1168;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1c] = local_11a0 * local_a50._0_8_ +
                    auVar76._0_8_ + dVar128 * (double)local_b30._32_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1d] = dStack_1198 * local_a50._8_8_ +
                    auVar76._8_8_ + dVar19 * (double)local_b30._40_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1e] = dStack_1190 * local_a50._16_8_ +
                    auVar76._16_8_ + dVar18 * (double)local_b30._48_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1f] = dStack_1188 * local_a50._24_8_ +
                    auVar76._24_8_ + dVar25 * (double)local_b30._56_8_;
      auVar76 = vmulpd_avx512vl(local_a90,auVar38);
      auVar77 = vmulpd_avx512vl(local_a30,auVar40);
      auVar78 = vmulpd_avx512vl(auVar39,_local_1640);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x20] = auVar77._0_8_ + auVar76._0_8_ + auVar78._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x21] = auVar77._8_8_ + auVar76._8_8_ + auVar78._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x22] = auVar77._16_8_ + auVar76._16_8_ + auVar78._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x23] = auVar77._24_8_ + auVar76._24_8_ + auVar78._24_8_;
      auVar80._8_8_ = dStack_960;
      auVar80._0_8_ = local_968;
      auVar80._16_8_ = dStack_958;
      auVar80._24_8_ = dStack_950;
      auVar76 = vmulpd_avx512vl(auVar36,auVar80);
      auVar77 = vmulpd_avx512vl(auVar34,local_15c0);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x45] = local_11c0 * dVar100 + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x46] = dStack_11b8 * dVar106 + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x47] = dStack_11b0 * dVar107 + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x48] = dStack_11a8 * dVar108 + auVar76._24_8_ + auVar77._24_8_;
      auVar76 = vmulpd_avx512vl(auVar94,auVar37);
      auVar77 = vmulpd_avx512vl(auVar29,local_13c0);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x49] = local_11a0 * local_8e8._0_8_ + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4a] = dStack_1198 * local_8e8._8_8_ + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4b] = dStack_1190 * local_8e8._16_8_ + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4c] = dStack_1188 * local_8e8._24_8_ + auVar76._24_8_ + auVar77._24_8_;
      auVar76 = vmulpd_avx512vl(auVar26,auVar38);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4d] = local_8c8._0_8_ * local_1180 +
                    auVar76._0_8_ + (double)local_1640._0_8_ * local_988;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4e] = local_8c8._8_8_ * dStack_1178 +
                    auVar76._8_8_ + (double)local_1640._8_8_ * dStack_980;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4f] = local_8c8._16_8_ * dStack_1170 + auVar76._16_8_ + dStack_1630 * dStack_978;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x50] = local_8c8._24_8_ * dStack_1168 + auVar76._24_8_ + dStack_1628 * dStack_970;
      auVar76 = vmulpd_avx512vl(local_800,auVar36);
      auVar77 = vmulpd_avx512vl(auVar35,local_15c0);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x72] = dVar118 * local_11c0 + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x73] = dVar10 * dStack_11b8 + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x74] = dVar15 * dStack_11b0 + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x75] = dVar22 * dStack_11a8 + auVar76._24_8_ + auVar77._24_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x76] = dVar6 * local_11a0 + (double)local_16a0._0_8_ * local_1220 + local_840 * dVar128
      ;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x77] = dVar11 * dStack_1198 +
                    (double)local_16a0._8_8_ * dStack_1218 + dStack_838 * dVar19;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x78] = dVar16 * dStack_1190 +
                    (double)auStack_1690._0_8_ * dStack_1210 + dStack_830 * dVar18;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x79] = dVar23 * dStack_1188 +
                    (double)auStack_1690._8_8_ * dStack_1208 + dStack_828 * dVar25;
      auVar76 = vmulpd_avx512vl(local_7c0,auVar38);
      auVar77 = vmulpd_avx512vl(auVar87,_local_1640);
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7a] = dVar7 * local_1180 + auVar76._0_8_ + auVar77._0_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7b] = dVar12 * dStack_1178 + auVar76._8_8_ + auVar77._8_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7c] = dVar17 * dStack_1170 + auVar76._16_8_ + auVar77._16_8_;
      local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7d] = dVar24 * dStack_1168 + auVar76._24_8_ + auVar77._24_8_;
      _local_16a0 = auVar56;
      _local_1320 = auVar57;
      _local_12c0 = auVar58;
      _local_12a0 = auVar59;
      if (((this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows == 3) &&
         ((this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols == 1)) {
        auVar75._8_8_ = 0;
        auVar75._0_8_ = dVar124;
        pauVar5 = (undefined1 (*) [16])
                  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        p_Var4 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = local_598;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = local_9d0;
        auVar66 = vmulsd_avx512f(auVar138,auVar68);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_430;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = local_868;
        auVar67 = vmulsd_avx512f(auVar134,auVar69);
        auVar72._8_8_ = 0;
        auVar72._0_8_ = local_2c8;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = local_700;
        auVar68 = vmulsd_avx512f(auVar136,auVar72);
        dVar124 = *(double *)pauVar5[1];
        auVar119._8_8_ = 0;
        auVar119._0_8_ = dVar124;
        auVar69 = vmovddup_avx512vl(auVar75);
        auVar66 = vaddsd_avx512f(auVar66,auVar67);
        auVar68 = vaddsd_avx512f(auVar66,auVar68);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = local_a00 * local_5c8 + local_898 * local_460 + local_730 * local_2f8;
        auVar66 = vmulsd_avx512f(auVar75,auVar101);
        auVar74._8_8_ = 0;
        auVar74._0_8_ = local_a00 * local_a00 + local_898 * local_898 + local_730 * local_730 + -1.0
        ;
        auVar67 = vmulsd_avx512f(auVar74,ZEXT816(0x3fe0000000000000));
        auVar98._8_8_ = 0;
        auVar98._0_8_ = auVar66._0_8_ + auVar67._0_8_;
        auVar70 = vmulsd_avx512f(auVar98,auVar119);
        auVar66 = *pauVar5;
        peVar3 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        dVar128 = auVar69._0_8_;
        dVar131 = auVar69._8_8_;
        auVar102._0_8_ =
             (local_a10 * local_a10 + local_8a8 * local_8a8 + local_740 * local_740 + -1.0) * 0.5 +
             dVar128 * (local_a10 * local_5d8 + local_8a8 * local_470 + local_740 * local_308);
        auVar102._8_8_ =
             (dStack_a08 * dStack_a08 + dStack_8a0 * dStack_8a0 + dStack_738 * dStack_738 + -1.0) *
             0.5 + dVar131 * (dStack_a08 * dStack_5d0 + dStack_8a0 * dStack_468 +
                             dStack_738 * dStack_300);
        auVar71 = vmulpd_avx512vl(auVar66,auVar102);
        auVar122._0_8_ =
             (local_9f8 * local_9f8 + local_890 * local_890 + local_728 * local_728 + -1.0) * 0.5 +
             (local_9f8 * local_5c0 + local_890 * local_458 + local_728 * local_2f0) * dVar128;
        auVar122._8_8_ =
             (dStack_9f0 * dStack_9f0 + dStack_888 * dStack_888 + dStack_720 * dStack_720 + -1.0) *
             0.5 + (dStack_9f0 * dStack_5b8 + dStack_888 * dStack_450 + dStack_720 * dStack_2e8) *
                   dVar131;
        auVar67 = vmulpd_avx512vl(auVar66,auVar122);
        auVar133._8_8_ = 0;
        auVar133._0_8_ = local_880 * local_448 + local_9e8 * local_5b0 + local_718 * local_2e0;
        auVar69 = vmulsd_avx512f(auVar75,auVar133);
        auVar125._8_8_ = 0;
        auVar125._0_8_ =
             local_9e8 * local_9e8 + local_880 * local_880 + local_718 * local_718 + -1.0;
        auVar72 = vmulsd_avx512f(auVar125,ZEXT816(0x3fe0000000000000));
        auVar126._8_8_ = 0;
        auVar126._0_8_ = auVar69._0_8_ + auVar72._0_8_;
        auVar73 = vmulsd_avx512f(auVar119,auVar126);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = local_868;
        auVar69 = vmulsd_avx512f(auVar134,auVar135);
        auVar139._8_8_ = 0;
        auVar139._0_8_ = local_9d0;
        auVar72 = vmulsd_avx512f(auVar138,auVar139);
        auVar137._8_8_ = 0;
        auVar137._0_8_ = local_700;
        auVar74 = vmulsd_avx512f(auVar136,auVar137);
        auVar68 = vmulsd_avx512f(auVar75,auVar68);
        auVar112._8_8_ = 0;
        auVar112._0_8_ = auVar72._0_8_ + auVar69._0_8_ + auVar74._0_8_ + -1.0;
        auVar69 = vmulsd_avx512f(auVar112,ZEXT816(0x3fe0000000000000));
        dVar128 = auVar66._0_8_ *
                  ((local_9e0 * local_9e0 + local_878 * local_878 + local_710 * local_710 + -1.0) *
                   0.5 + (local_9e0 * local_5a8 + local_878 * local_440 + local_710 * local_2d8) *
                         dVar128);
        dVar131 = auVar66._8_8_ *
                  ((dStack_9d8 * dStack_9d8 + dStack_870 * dStack_870 + dStack_708 * dStack_708 +
                   -1.0) * 0.5 +
                  (dStack_9d8 * dStack_5a0 + dStack_870 * dStack_438 + dStack_708 * dStack_2d0) *
                  dVar131);
        dVar124 = dVar124 * (auVar68._0_8_ + auVar69._0_8_);
        if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          auVar66 = *(undefined1 (*) [16])
                     (peVar3->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array;
          auVar68 = *(undefined1 (*) [16])
                     ((long)(peVar3->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
          auVar1 = *(undefined1 (*) [16])
                    ((long)(peVar3->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x20);
          auVar2 = *(undefined1 (*) [16])
                    ((long)(peVar3->m_Dv).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x30);
          dVar132 = *(double *)
                     ((long)(peVar3->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x40);
        }
        else {
          vmovsd_avx512f(auVar70);
          local_1660 = auVar71._0_8_;
          dStack_1658 = auVar71._8_8_;
          vmovsd_avx512f(auVar73);
          auStack_1690 = local_7e0._16_16_;
          local_16a0 = auVar67;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
          local_1700._16_16_ = local_b30._112_16_;
          local_1700._0_16_ =
               *(undefined1 (*) [16])
                (peVar3->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                m_storage.m_data.array;
          auVar68 = *(undefined1 (*) [16])
                     ((long)(peVar3->m_Dv).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
          local_15e0 = *(double *)
                        ((long)(peVar3->m_Dv).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x20);
          dStack_15d8 = *(double *)
                         ((long)(peVar3->m_Dv).
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 0x28);
          local_1600 = *(double *)
                        ((long)(peVar3->m_Dv).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x30);
          dStack_15f8 = *(double *)
                         ((long)(peVar3->m_Dv).
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 0x38);
          local_1620 = *(double *)
                        ((long)(peVar3->m_Dv).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x40);
          dStack_1618 = 0.0;
          local_16e0 = dVar128;
          dStack_16d8 = dVar131;
          local_16c0 = dVar124;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          auVar1._8_8_ = dStack_15d8;
          auVar1._0_8_ = local_15e0;
          auVar2._8_8_ = dStack_15f8;
          auVar2._0_8_ = local_1600;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = local_1720._0_8_;
          auVar71._8_8_ = dStack_1658;
          auVar71._0_8_ = local_1660;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = local_1680;
          auVar66 = local_1700._0_16_;
          auVar67 = local_16a0;
          dVar124 = local_16c0;
          dVar132 = local_1620;
          dVar128 = local_16e0;
          dVar131 = dStack_16d8;
        }
        auVar116._8_8_ = auVar66._0_8_;
        auVar116._0_8_ = auVar66._0_8_;
        auVar69 = vshufpd_avx(auVar66,auVar66,3);
        auVar72 = vshufpd_avx(auVar66,auVar66,1);
        auVar120._8_8_ = auVar1._0_8_;
        auVar120._0_8_ = auVar1._0_8_;
        auVar69 = vmulpd_avx512vl(auVar67,auVar69);
        auVar72 = vmulsd_avx512f(auVar73,auVar72);
        auVar75 = vmulpd_avx512vl(auVar71,auVar116);
        auVar74 = vmulpd_avx512vl(auVar67,auVar120);
        dVar118 = auVar68._0_8_;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7e] = dVar128 * dVar118 + auVar75._0_8_ + auVar69._0_8_;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7f] = dVar131 * dVar118 + auVar75._8_8_ + auVar69._8_8_;
        auVar69 = vmulsd_avx512f(auVar70,auVar66);
        auVar66 = vshufpd_avx(auVar1,auVar1,1);
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x80] = dVar124 * dVar118 + auVar69._0_8_ + auVar72._0_8_;
        auVar69 = vshufpd_avx(auVar68,auVar68,1);
        auVar68 = vshufpd_avx(auVar68,auVar68,3);
        auVar72 = vmulpd_avx512vl(auVar71,auVar68);
        auVar69 = vmulsd_avx512f(auVar70,auVar69);
        auVar68 = vshufpd_avx(auVar1,auVar1,3);
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x54] = dVar128 * auVar68._0_8_ + auVar74._0_8_ + auVar72._0_8_;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x55] = dVar131 * auVar68._8_8_ + auVar74._8_8_ + auVar72._8_8_;
        auVar72 = vmulsd_avx512f(auVar73,auVar1);
        auVar68 = vshufpd_avx(auVar2,auVar2,3);
        auVar67 = vmulpd_avx512vl(auVar67,auVar68);
        auVar121._8_8_ = auVar2._0_8_;
        auVar121._0_8_ = auVar2._0_8_;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x81] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x54] * local_728;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x82] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x55] * dStack_720;
        auVar68 = vmulpd_avx512vl(auVar71,auVar121);
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x83] = dVar124 * auVar66._0_8_ + auVar72._0_8_ + auVar69._0_8_;
        auVar66 = vshufpd_avx(auVar2,auVar2,1);
        auVar66 = vmulsd_avx512f(auVar73,auVar66);
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x26] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_a00;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x29] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_9e8;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x56] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_880;
        auVar69 = vmulsd_avx512f(auVar70,auVar2);
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x24] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_a10;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x25] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_a08;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x84] = dVar128 * dVar132 + auVar68._0_8_ + auVar67._0_8_;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x85] = dVar131 * dVar132 + auVar68._8_8_ + auVar67._8_8_;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x86] = dVar124 * dVar132 + auVar69._0_8_ + auVar66._0_8_;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x51] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_8a8;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x52] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_8a0;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x53] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_898;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7e] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_740;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7f] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_738;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x80] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_730;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x27] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x54] * local_9f8;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x28] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x55] * dStack_9f0;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x54] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x54] * local_890;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x55] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x55] * dStack_888;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x83] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_718;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2a] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_9e0;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2b] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_9d8;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2c] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_9d0;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x57] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_878;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x58] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_870;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x59] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_868;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x84] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_710;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x85] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_708;
        local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x86] = local_f70.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_700;
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0x2d) {
          pcVar64 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 45, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 45, 3, 0>, Option = 0]"
          ;
          goto LAB_007099a8;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 8) {
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[8] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[9] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[10] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[3] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[5] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[6] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[7] = 0.0;
          local_1588 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,45,3,0,45,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,8,3,1,8,3>>(&local_2c0,a_lhs,&local_f70,&local_1588);
          pdVar63 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x18) {
            if (pdVar63 != (double *)0x0) {
              free((void *)pdVar63[-1]);
            }
            pvVar60 = malloc(0x100);
            if (pvVar60 == (void *)0x0) {
              puVar62 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar62 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar62,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            *(void **)(((ulong)pvVar60 & 0xffffffffffffffc0) + 0x38) = pvVar60;
            pdVar63 = (double *)(((ulong)pvVar60 & 0xffffffffffffffc0) + 0x40);
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar63;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x18;
          }
          uVar61 = 0xfffffffffffffff8;
          do {
            dVar124 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar61 + 9];
            dVar128 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar61 + 10];
            dVar131 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar61 + 0xb];
            dVar132 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar61 + 0xc];
            dVar118 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar61 + 0xd];
            dVar6 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                    .m_data.array[uVar61 + 0xe];
            dVar7 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                    .m_data.array[uVar61 + 0xf];
            pdVar65 = pdVar63 + uVar61 + 8;
            *pdVar65 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                       m_storage.m_data.array[uVar61 + 8];
            pdVar65[1] = dVar124;
            pdVar65[2] = dVar128;
            pdVar65[3] = dVar131;
            pdVar65[4] = dVar132;
            pdVar65[5] = dVar118;
            pdVar65[6] = dVar6;
            pdVar65[7] = dVar7;
            uVar61 = uVar61 + 8;
          } while (uVar61 < 0x10);
          return;
        }
        pcVar64 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 8, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 8, 3, 1>]"
        ;
        goto LAB_007099ca;
      }
      pcVar64 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar64 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar64);
  }
  pcVar64 = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 6, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 6, 0>]"
  ;
LAB_007099ca:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar64);
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For this element, this is likely more efficient than the "Pre-Integration" style calculation method.  Note that
    // the integrand for the generalize internal force vector for a straight and normalized element is of order : 8 in
    // xi, 4 in eta, and 4 in zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and
    // zeta directions for "Full Integration". However, very similar results can be obtained with fewer GQ point in each
    // direction, resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33  F13dot  F23dot  F33dot ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33  F13dot  F23dot  F33dot ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Since only the diagonal terms in the 6x6 stiffness matrix are used, the 2nd Piola-Kirchoff can be calculated by
    // simply scaling the vector of scaled Green-Lagrange strains in Voight notation by the corresponding diagonal entry
    // in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*(E11+alpha*E11dot)
    //     = D11*kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_D0 E_BlockDamping_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5));
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_1_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_1_Block_D0 *= (0.5 * D0(0));

    // Each entry in SPK2_2 = D22*kGQ*(E22+alpha*E22dot)
    //     = D22*kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_2_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_2_Block_D0 *= (0.5 * D0(1));

    // Each entry in SPK2_3 = D33*kGQ*(E33+alpha*E33dot)
    //     = D33*kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_3_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_3_Block_D0 *= (0.5 * D0(2));

    // Each entry in SPK2_4 = D44*kGQ*(2*(E23+alpha*E23dot))
    //     = D44*kGQ*((F12*F13+F22*F23+F32*F33)
    //       +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_4_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_4_Block_D0 *= D0(3);

    // Each entry in SPK2_5 = D55*kGQ*(2*(E13+alpha*E13dot))
    //     = D55*kGQ*((F11*F13+F21*F23+F31*F33)
    //       +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_5_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_5_Block_D0 *= D0(4);

    // Each entry in SPK2_6 = D66*kGQ*(2*(E12+alpha*E12dot))
    //     = D66*kGQ*((F11*F12+F21*F22+F31*F32)
    //       +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_6_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_6_Block_D0 *= D0(5);

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Block entries will be calculated separately in a later step.
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // Note that with the material assumption being used, only [E11,E22,E33] need to be calculated
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_Dv E_BlockDamping_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 3)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 4)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 5));
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv *= 0.5;
    E1_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E1_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 5));
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv *= 0.5;
    E2_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E2_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 5));
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv *= 0.5;
    E3_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E3_Block_Dv.array() *= m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled and already been
    // combined with their scaled time derivatives and minus the Gauss quadrature weight times the element Jacobian at
    // the corresponding Gauss point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 Block entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}